

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O3

void __thiscall
Refal2::CInternalProgramBuilder::linkFunction
          (CInternalProgramBuilder *this,CPreparatoryFunction *function,
          TRuntimeModuleId runtimeModuleId)

{
  CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  TPreparatoryFunctionType TVar1;
  _Rb_tree_color _Var2;
  element_type *peVar3;
  CRuntimeModule *pCVar4;
  CKeyDataPair *pCVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint uVar8;
  string *__k;
  const_iterator cVar9;
  COrdinaryFunction *__p;
  TOperationAddress pCVar10;
  CRuntimeFunction *__tmp;
  char *__function;
  shared_ptr<Refal2::CRuntimeFunction> *this_02;
  CPreparatoryFunction *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  if ((runtimeModuleId < 0) ||
     (peVar3 = (this->program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar3->modulesSize <= runtimeModuleId)) {
    __assert_fail("moduleId >= 0 && moduleId < modulesSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x18,"CRuntimeModule &Refal2::CProgram::Module(TRuntimeModuleId)");
  }
  pCVar4 = peVar3->modules;
  this_00 = &pCVar4[(uint)runtimeModuleId].Functions;
  uVar8 = CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::AddKey(this_00,&function->name);
  if ((-1 < (int)uVar8) && ((int)uVar8 < pCVar4[(uint)runtimeModuleId].Functions.size)) {
    pCVar5 = this_00->keyDataPairs;
    if (pCVar5[uVar8].data.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      __assert_fail("!static_cast<bool>( runtimeFunction )",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                    ,0x14d,
                    "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                   );
    }
    this_02 = &pCVar5[uVar8].data;
    TVar1 = function->type;
    if (TVar1 == PFT_Compiled) {
      __p = (COrdinaryFunction *)operator_new(0x18);
      pCVar10 = CPreparatoryFunction::FirstOperation(function);
      (__p->super_CRuntimeFunction).type = RFT_Ordinary;
      __p->firstOperation = pCVar10;
      __p->runtimeModuleId = runtimeModuleId;
      if (pCVar10 == (TOperationAddress)0x0) {
        __assert_fail("firstOperation != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Function.h"
                      ,0x4b,
                      "Refal2::COrdinaryFunction::COrdinaryFunction(const TOperationAddress, TRuntimeModuleId)"
                     );
      }
      std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
      reset<Refal2::COrdinaryFunction>
                (&this_02->super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>,
                 __p);
      return;
    }
    if (TVar1 != PFT_External) {
      if (TVar1 != PFT_Empty) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                      ,0x160,
                      "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                     );
      }
      peVar3 = (this->program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar6 = (peVar3->emptyFunction).
               super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (peVar3->emptyFunction).
               super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      (this_02->super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           peVar6;
      this_01 = pCVar5[uVar8].data.
                super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      pCVar5[uVar8].data.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var7;
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      return;
    }
    __k = CPreparatoryFunction::ExternalName_abi_cxx11_(function);
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(this->globals).keyToIndex._M_t,__k);
    if ((_Rb_tree_header *)cVar9._M_node !=
        &(this->globals).keyToIndex._M_t._M_impl.super__Rb_tree_header) {
      _Var2 = cVar9._M_node[2]._M_color;
      if ((ulong)_Var2 != 0xffffffff) {
        if ((-1 < (int)_Var2) && ((int)_Var2 < (this->globals).size)) {
          CGlobalFunctionData::RuntimeFunction
                    ((CGlobalFunctionData *)&local_48,
                     (CProgramPtr *)&(this->globals).keyDataPairs[_Var2].data);
          p_Var7 = pCVar5[uVar8].data.
                   super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (this_02->super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               = (element_type *)local_48;
          pCVar5[uVar8].data.
          super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = p_Stack_40;
          if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          return;
        }
        __function = 
        "Data &Refal2::CDictionary<Refal2::CGlobalFunctionData>::GetData(int) const [Data = Refal2::CGlobalFunctionData, Key = std::basic_string<char>]"
        ;
        goto LAB_001296bc;
      }
    }
    __assert_fail("globalIndex != InvalidDictionaryIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x15a,
                  "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                 );
  }
  __function = 
  "Data &Refal2::CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>>::GetData(int) const [Data = std::shared_ptr<Refal2::CRuntimeFunction>, Key = std::basic_string<char>]"
  ;
LAB_001296bc:
  __assert_fail("index >= 0 && index < size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Dictionary.h"
                ,0x8e,__function);
}

Assistant:

CRuntimeModule& CProgram::Module( TRuntimeModuleId moduleId )
{
	assert( moduleId >= 0 && moduleId < modulesSize );
	return modules[moduleId];
}